

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderSingle.h
# Opt level: O0

void __thiscall
FIX42::NewOrderSingle::NewOrderSingle
          (NewOrderSingle *this,ClOrdID *aClOrdID,HandlInst *aHandlInst,Symbol *aSymbol,Side *aSide,
          TransactTime *aTransactTime,OrdType *aOrdType)

{
  MsgType local_90;
  TransactTime *local_38;
  TransactTime *aTransactTime_local;
  Side *aSide_local;
  Symbol *aSymbol_local;
  HandlInst *aHandlInst_local;
  ClOrdID *aClOrdID_local;
  NewOrderSingle *this_local;
  
  local_38 = aTransactTime;
  aTransactTime_local = (TransactTime *)aSide;
  aSide_local = (Side *)aSymbol;
  aSymbol_local = (Symbol *)aHandlInst;
  aHandlInst_local = (HandlInst *)aClOrdID;
  aClOrdID_local = (ClOrdID *)this;
  MsgType();
  FIX42::Message::Message(&this->super_Message,&local_90);
  FIX::MsgType::~MsgType(&local_90);
  *(undefined ***)&this->super_Message = &PTR__NewOrderSingle_0018a038;
  set(this,(ClOrdID *)aHandlInst_local);
  set(this,(HandlInst *)aSymbol_local);
  set(this,(Symbol *)aSide_local);
  set(this,(Side *)aTransactTime_local);
  set(this,local_38);
  set(this,aOrdType);
  return;
}

Assistant:

NewOrderSingle(
      const FIX::ClOrdID& aClOrdID,
      const FIX::HandlInst& aHandlInst,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide,
      const FIX::TransactTime& aTransactTime,
      const FIX::OrdType& aOrdType )
    : Message(MsgType())
    {
      set(aClOrdID);
      set(aHandlInst);
      set(aSymbol);
      set(aSide);
      set(aTransactTime);
      set(aOrdType);
    }